

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O2

void __thiscall slang::JsonWriter::endArray(JsonWriter *this)

{
  _Head_base<0UL,_slang::FormatBuffer_*,_false> this_00;
  size_t count;
  format_string<const_char_(&)[1],_int_&> fmt;
  
  this_00._M_head_impl =
       (this->buffer)._M_t.
       super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>._M_t.
       super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>.
       super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
  count = findLastComma(this);
  ::fmt::v11::detail::buffer<char>::try_resize((buffer<char> *)this_00._M_head_impl,count);
  if (this->pretty == true) {
    this->currentIndent = this->currentIndent - this->indentSize;
    fmt.str.size_ = 7;
    fmt.str.data_ = "\n{:{}}]";
    FormatBuffer::format<char_const(&)[1],int&>
              ((this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,
               (char (*) [1])0x413ded,&this->currentIndent);
    endValue(this);
    return;
  }
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"],","");
  return;
}

Assistant:

void JsonWriter::endArray() {
    buffer->resize(findLastComma());
    if (pretty) {
        currentIndent -= indentSize;
        buffer->format("\n{:{}}]", "", currentIndent);
        endValue();
    }
    else {
        buffer->append("],");
    }
}